

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpserver.c
# Opt level: O1

void uss_fsetstat(SftpServer *srv,SftpReplyBuilder *reply,ptrlen handle,fxp_attrs attrs)

{
  int iVar1;
  int iVar2;
  SftpReplyBuilder *reply_00;
  timeval *ptVar3;
  bool bVar4;
  timeval local_48;
  unsigned_long local_38;
  undefined8 local_30;
  
  ptVar3 = &local_48;
  reply_00 = reply;
  iVar1 = uss_lookup_fd((UnixSftpServer *)(srv + -6),reply,handle);
  if (-1 < iVar1) {
    bVar4 = true;
    if (((undefined1  [56])attrs & (undefined1  [56])0x1) != (undefined1  [56])0x0) {
      reply_00 = (SftpReplyBuilder *)attrs.size;
      iVar2 = ftruncate(iVar1,attrs.size);
      bVar4 = -1 < iVar2;
    }
    if (((undefined1  [56])attrs & (undefined1  [56])0x2) != (undefined1  [56])0x0) {
      reply_00 = (SftpReplyBuilder *)(ulong)(uint)attrs.uid;
      iVar2 = fchown(iVar1,(uint)attrs.uid,(__gid_t)attrs.gid);
      if (iVar2 < 0) {
        bVar4 = false;
      }
    }
    if (((undefined1  [56])attrs & (undefined1  [56])0x4) != (undefined1  [56])0x0) {
      reply_00 = (SftpReplyBuilder *)(ulong)(uint)attrs.permissions;
      iVar2 = fchmod(iVar1,(uint)attrs.permissions);
      if (iVar2 < 0) {
        bVar4 = false;
      }
    }
    if (((undefined1  [56])attrs & (undefined1  [56])0x8) != (undefined1  [56])0x0) {
      local_48.tv_sec = attrs.atime;
      local_38 = attrs.mtime;
      local_30 = 0;
      local_48.tv_usec = 0;
      iVar1 = futimes(iVar1,&local_48);
      reply_00 = (SftpReplyBuilder *)ptVar3;
      if (iVar1 < 0) {
        bVar4 = false;
      }
    }
    if (bVar4) {
      (*reply->vt->reply_ok)(reply);
    }
    else {
      uss_error((UnixSftpServer *)reply,reply_00);
    }
  }
  return;
}

Assistant:

static void uss_fsetstat(SftpServer *srv, SftpReplyBuilder *reply,
                         ptrlen handle, struct fxp_attrs attrs)
{
    UnixSftpServer *uss = container_of(srv, UnixSftpServer, srv);
    int fd;

    if ((fd = uss_lookup_fd(uss, reply, handle)) < 0)
        return;

    bool success = true;
    SETSTAT_GUTS(FD_PREFIX, fd, attrs, success);

    if (!success) {
        uss_error(uss, reply);
    } else {
        fxp_reply_ok(reply);
    }
}